

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int in_ESI;
  long in_RDI;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem step_mem;
  int retval;
  ARKodeMRIStepMem *in_stack_ffffffffffffffc8;
  MRIStepCoupling in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  long local_20;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (in_ESI < 1) {
      *(undefined4 *)(local_20 + 0x40) = 3;
    }
    else {
      *(int *)(local_20 + 0x40) = in_ESI;
    }
    *(undefined4 *)(local_20 + 0x48) = 0;
    *(undefined4 *)(local_20 + 0x44) = 0;
    MRIStepCoupling_Space
              (*(MRIStepCoupling *)(local_20 + 0x38),(sunindextype *)&stack0xffffffffffffffd0,
               (sunindextype *)&stack0xffffffffffffffd8);
    MRIStepCoupling_Free(in_stack_ffffffffffffffd0);
    *(undefined8 *)(local_20 + 0x38) = 0;
    *(long *)(in_RDI + 0x350) = *(long *)(in_RDI + 0x350) - (long)in_stack_ffffffffffffffd0;
    *(long *)(in_RDI + 0x348) = *(long *)(in_RDI + 0x348) - (long)in_stack_ffffffffffffffd8;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  int retval;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval) { return (retval); }

  /* check for illegal inputs */
  if (ord <= 0) { step_mem->q = 3; }
  else { step_mem->q = ord; }

  /* Clear tables, the user is requesting a change in method or a reset to
     defaults. Tables will be set in InitialSetup. */
  step_mem->stages = 0;
  step_mem->p      = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  return (ARK_SUCCESS);
}